

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plot.hpp
# Opt level: O2

void __thiscall sciplot::Plot::yrange(Plot *this,double min,double max)

{
  double local_e0;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  double local_58;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_e0 = max;
  local_58 = min;
  internal::str<double>(&local_50,&local_58);
  std::operator+(&local_b8,"[",&local_50);
  std::operator+(&local_98,&local_b8,":");
  internal::str<double>(&local_d8,&local_e0);
  std::operator+(&local_78,&local_98,&local_d8);
  std::operator+(&local_30,&local_78,"]");
  std::__cxx11::string::operator=((string *)&this->m_yrange,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

inline auto Plot::yrange(double min, double max) -> void
{
    m_yrange = "[" + internal::str(min) + ":" + internal::str(max) + "]";
}